

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

Page * __thiscall http::Page::HTMLEncode(Page *this,string *str)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_1d8;
  size_t i;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [376];
  string local_38 [8];
  string rc;
  string *str_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::stringstream::stringstream(local_1c0);
  local_1d8 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_1d8) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar2 == '<') {
      std::operator<<(local_1b0,"&lt");
    }
    else if (*pcVar2 == '>') {
      std::operator<<(local_1b0,"&gt");
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
      std::operator<<(local_1b0,*pcVar2);
    }
    local_1d8 = local_1d8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string http::Page::HTMLEncode(const std::string& str)
{
    std::string rc;
    std::stringstream ss;
    for (size_t i = 0; i < str.size(); i++)
    {
        switch (str[i])
        {
        case '<': ss << "&lt"; break;

        case '>': ss << "&gt"; break;

        default: ss << str[i]; break;
        }
    }
    return ss.str();
}